

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::eliminateColSingletons
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  long lVar7;
  long in_RDI;
  Pring *sing;
  int prow;
  int pcol;
  int c;
  int m;
  int k;
  int j;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000328;
  int in_stack_00000334;
  int in_stack_00000338;
  int in_stack_0000033c;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000340;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined1 local_d0 [128];
  long local_50;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  reference local_20;
  undefined1 *local_18;
  reference local_10;
  reference local_8;
  
  for (local_50 = *(long *)(*(long *)(in_RDI + 0x490) + 0x28);
      local_50 != *(long *)(in_RDI + 0x490) + 0x20; local_50 = *(long *)(local_50 + 8)) {
    local_40 = *(int *)(local_50 + 0x10);
    iVar3 = *(int *)(*(long *)(in_RDI + 0x400) + (long)local_40 * 4) + -1;
    *(int *)(*(long *)(in_RDI + 0x400) + (long)local_40 * 4) = iVar3;
    local_44 = *(int *)(*(long *)(in_RDI + 0x3d8) +
                       (long)(iVar3 + *(int *)(*(long *)(in_RDI + 0x3f8) + (long)local_40 * 4)) * 4)
    ;
    *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x498) + (long)local_44 * 0x20) + 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x498) + (long)local_44 * 0x20 + 8);
    **(undefined8 **)(*(long *)(in_RDI + 0x498) + (long)local_44 * 0x20 + 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x498) + (long)local_44 * 0x20);
    local_30 = *(int *)(*(long *)(in_RDI + 0x3a0) + (long)local_44 * 4) + -1;
    *(int *)(*(long *)(in_RDI + 0x3a0) + (long)local_44 * 4) = local_30;
    local_30 = local_30 + *(int *)(*(long *)(in_RDI + 0x398) + (long)local_44 * 4);
    local_2c = local_30;
    while (local_3c = *(int *)(*(long *)(in_RDI + 0x390) + (long)local_2c * 4), local_3c != local_40
          ) {
      iVar3 = *(int *)(*(long *)(in_RDI + 0x400) + (long)local_3c * 4);
      iVar1 = *(int *)(*(long *)(in_RDI + 0x3f8) + (long)local_3c * 4);
      iVar4 = *(int *)(*(long *)(in_RDI + 0x458) + (long)local_3c * 4);
      *(int *)(*(long *)(in_RDI + 0x458) + (long)local_3c * 4) = iVar4 + -1;
      iVar4 = (iVar3 + iVar1) - iVar4;
      local_34 = iVar4;
      while (*(int *)(*(long *)(in_RDI + 0x3d8) + (long)local_34 * 4) != local_44) {
        local_34 = local_34 + 1;
      }
      *(undefined4 *)(*(long *)(in_RDI + 0x3d8) + (long)local_34 * 4) =
           *(undefined4 *)(*(long *)(in_RDI + 0x3d8) + (long)iVar4 * 4);
      *(int *)(*(long *)(in_RDI + 0x3d8) + (long)iVar4 * 4) = local_44;
      local_38 = *(int *)(*(long *)(in_RDI + 0x458) + (long)local_3c * 4);
      *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x488) + (long)local_3c * 0x20) + 8) =
           *(undefined8 *)(*(long *)(in_RDI + 0x488) + (long)local_3c * 0x20 + 8);
      **(undefined8 **)(*(long *)(in_RDI + 0x488) + (long)local_3c * 0x20 + 8) =
           *(undefined8 *)(*(long *)(in_RDI + 0x488) + (long)local_3c * 0x20);
      *(undefined8 *)(*(long *)(in_RDI + 0x488) + (long)local_3c * 0x20) =
           *(undefined8 *)(*(long *)(in_RDI + 0x490) + (long)local_38 * 0x20);
      *(long *)(*(long *)(*(long *)(in_RDI + 0x488) + (long)local_3c * 0x20) + 8) =
           *(long *)(in_RDI + 0x488) + (long)local_3c * 0x20;
      *(long *)(*(long *)(in_RDI + 0x488) + (long)local_3c * 0x20 + 8) =
           *(long *)(in_RDI + 0x490) + (long)local_38 * 0x20;
      *(long *)(*(long *)(in_RDI + 0x490) + (long)local_38 * 0x20) =
           *(long *)(in_RDI + 0x488) + (long)local_3c * 0x20;
      local_2c = local_2c + -1;
    }
    iVar3 = *(int *)(in_RDI + 0x460);
    *(int *)(in_RDI + 0x460) = iVar3 + 1;
    local_20 = std::
               vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             *)(in_RDI + 0x378),(long)local_2c);
    local_18 = local_d0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)CONCAT44(iVar3,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
    setPivot(in_stack_00000340,in_stack_0000033c,in_stack_00000338,in_stack_00000334,
             in_stack_00000328);
    *(undefined4 *)(*(long *)(in_RDI + 0x390) + (long)local_2c * 4) =
         *(undefined4 *)(*(long *)(in_RDI + 0x390) + (long)local_30 * 4);
    pvVar6 = std::
             vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           *)(in_RDI + 0x378),(long)local_30);
    local_8 = std::
              vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            *)(in_RDI + 0x378),(long)local_2c);
    local_10 = pvVar6;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)CONCAT44(iVar3,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
    iVar3 = *(int *)(*(long *)(in_RDI + 0x398) + (long)local_44 * 4);
    while (local_2c = local_2c + -1, iVar3 <= local_2c) {
      iVar1 = *(int *)(*(long *)(in_RDI + 0x390) + (long)local_2c * 4);
      iVar4 = *(int *)(*(long *)(in_RDI + 0x400) + (long)iVar1 * 4);
      iVar2 = *(int *)(*(long *)(in_RDI + 0x3f8) + (long)iVar1 * 4);
      iVar5 = *(int *)(*(long *)(in_RDI + 0x458) + (long)iVar1 * 4);
      *(int *)(*(long *)(in_RDI + 0x458) + (long)iVar1 * 4) = iVar5 + -1;
      iVar5 = (iVar4 + iVar2) - iVar5;
      local_34 = iVar5;
      while (*(int *)(*(long *)(in_RDI + 0x3d8) + (long)local_34 * 4) != local_44) {
        local_34 = local_34 + 1;
      }
      *(undefined4 *)(*(long *)(in_RDI + 0x3d8) + (long)local_34 * 4) =
           *(undefined4 *)(*(long *)(in_RDI + 0x3d8) + (long)iVar5 * 4);
      *(int *)(*(long *)(in_RDI + 0x3d8) + (long)iVar5 * 4) = local_44;
      local_38 = *(int *)(*(long *)(in_RDI + 0x458) + (long)iVar1 * 4);
      *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x488) + (long)iVar1 * 0x20) + 8) =
           *(undefined8 *)(*(long *)(in_RDI + 0x488) + (long)iVar1 * 0x20 + 8);
      **(undefined8 **)(*(long *)(in_RDI + 0x488) + (long)iVar1 * 0x20 + 8) =
           *(undefined8 *)(*(long *)(in_RDI + 0x488) + (long)iVar1 * 0x20);
      *(undefined8 *)(*(long *)(in_RDI + 0x488) + (long)iVar1 * 0x20) =
           *(undefined8 *)(*(long *)(in_RDI + 0x490) + (long)local_38 * 0x20);
      *(long *)(*(long *)(*(long *)(in_RDI + 0x488) + (long)iVar1 * 0x20) + 8) =
           *(long *)(in_RDI + 0x488) + (long)iVar1 * 0x20;
      *(long *)(*(long *)(in_RDI + 0x488) + (long)iVar1 * 0x20 + 8) =
           *(long *)(in_RDI + 0x490) + (long)local_38 * 0x20;
      *(long *)(*(long *)(in_RDI + 0x490) + (long)local_38 * 0x20) =
           *(long *)(in_RDI + 0x488) + (long)iVar1 * 0x20;
    }
  }
  lVar7 = *(long *)(in_RDI + 0x490) + 0x20;
  *(long *)(*(long *)(in_RDI + 0x490) + 0x20) = lVar7;
  *(long *)(*(long *)(in_RDI + 0x490) + 0x28) = lVar7;
  return;
}

Assistant:

void CLUFactor<R>::eliminateColSingletons()
{
   int i, j, k, m, c;
   int pcol, prow;
   CLUFactor<R>::Pring* sing;

   for(sing = temp.pivot_colNZ[1].prev;
         sing != &(temp.pivot_colNZ[1]);
         sing = sing->prev)
   {
      /*      Find pivot value
       */
      pcol = sing->idx;
      j = --(u.col.len[pcol]) + u.col.start[pcol];   /* remove pivot column */
      prow = u.col.idx[j];
      removeDR(temp.pivot_row[prow]);

      j = --(u.row.len[prow]) + u.row.start[prow];

      for(i = j; (c = u.row.idx[i]) != pcol; --i)
      {
         m = u.col.len[c] + u.col.start[c] - (temp.s_cact[c])--;

         for(k = m; u.col.idx[k] != prow; ++k)
            ;

         u.col.idx[k] = u.col.idx[m];

         u.col.idx[m] = prow;

         m = temp.s_cact[c];

         removeDR(temp.pivot_col[c]);

         init2DR(temp.pivot_col[c], temp.pivot_colNZ[m]);

         assert(col.perm[c] < 0);
      }

      /*      remove pivot element from pivot row
       */
      setPivot(temp.stage++, pcol, prow, u.row.val[i]);

      u.row.idx[i] = u.row.idx[j];

      u.row.val[i] = u.row.val[j];

      j = u.row.start[prow];

      for(--i; i >= j; --i)
      {
         c = u.row.idx[i];
         m = u.col.len[c] + u.col.start[c] - (temp.s_cact[c])--;

         for(k = m; u.col.idx[k] != prow; ++k)
            ;

         u.col.idx[k] = u.col.idx[m];

         u.col.idx[m] = prow;

         m = temp.s_cact[c];

         removeDR(temp.pivot_col[c]);

         init2DR(temp.pivot_col[c], temp.pivot_colNZ[m]);

         assert(col.perm[c] < 0);
      }
   }

   initDR(temp.pivot_colNZ[1]);    /* Remove all column singletons from list */
}